

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mojoshader_assembler.c
# Opt level: O0

int parse_num(Context_conflict *ctx,int floatok,uint32 *value)

{
  Token local_40;
  Token local_3c;
  Token local_38;
  Token local_34;
  int d;
  Token token;
  int negative;
  anon_union_4_3_ec4f19c4 cvt;
  uint32 *value_local;
  Context_conflict *pCStack_18;
  int floatok_local;
  Context_conflict *ctx_local;
  
  d = 0;
  _negative = value;
  value_local._4_4_ = floatok;
  pCStack_18 = ctx;
  local_34 = nexttoken(ctx);
  if (local_34 == 0x2d) {
    d = 1;
    local_34 = nexttoken(pCStack_18);
  }
  if (local_34 == TOKEN_INT_LITERAL) {
    local_38 = 0;
    __isoc99_sscanf(pCStack_18->token,"%d",&local_38);
    if (value_local._4_4_ == 0) {
      if (d == 0) {
        local_40 = local_38;
      }
      else {
        local_40 = -local_38;
      }
      token = local_40;
    }
    else {
      if (d == 0) {
        local_3c = local_38;
      }
      else {
        local_3c = -local_38;
      }
      token = (Token)(float)(int)local_3c;
    }
  }
  else {
    if (local_34 != TOKEN_FLOAT_LITERAL) {
      fail(pCStack_18,"Expected number");
      *_negative = 0;
      return 0;
    }
    if (value_local._4_4_ == 0) {
      fail(pCStack_18,"Expected whole number");
      *_negative = 0;
      return 0;
    }
    __isoc99_sscanf(pCStack_18->token,"%f",&token);
    if (d != 0) {
      token = token ^ 0x80000000;
    }
  }
  *_negative = token;
  return 1;
}

Assistant:

static int parse_num(Context *ctx, const int floatok, uint32 *value)
{
    union { float f; int32 si32; uint32 ui32; } cvt;
    int negative = 0;
    Token token = nexttoken(ctx);

    if (token == ((Token) '-'))
    {
        negative = 1;
        token = nexttoken(ctx);
    } // if

    if (token == TOKEN_INT_LITERAL)
    {
        int d = 0;
        sscanf(ctx->token, "%d", &d);
        if (floatok)
            cvt.f = (float) ((negative) ? -d : d);
        else
            cvt.si32 = (int32) ((negative) ? -d : d);
    } // if
    else if (token == TOKEN_FLOAT_LITERAL)
    {
        if (!floatok)
        {
            fail(ctx, "Expected whole number");
            *value = 0;
            return 0;
        } // if
        sscanf(ctx->token, "%f", &cvt.f);
        if (negative)
            cvt.f = -cvt.f;
    } // if
    else
    {
        fail(ctx, "Expected number");
        *value = 0;
        return 0;
    } // else

    *value = cvt.ui32;
    return 1;
}